

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level.cxx
# Opt level: O2

xr_level_snd_env * load<xray_re::xr_level_snd_env>(char *path,char *name,bool required)

{
  xr_file_system *this;
  xr_reader *r;
  xr_level_snd_env *this_00;
  
  this = xray_re::xr_file_system::instance();
  r = xray_re::xr_file_system::r_open(this,path,name);
  if (r == (xr_reader *)0x0) {
    this_00 = (xr_level_snd_env *)0x0;
  }
  else {
    xray_re::msg("loading %s",name);
    this_00 = (xr_level_snd_env *)operator_new(0x68);
    xray_re::xr_level_snd_env::xr_level_snd_env(this_00,r);
    (*r->_vptr_xr_reader[1])(r);
  }
  return this_00;
}

Assistant:

static T* load(const char* path, const char* name, bool required = false)
{
	xr_file_system& fs = xr_file_system::instance();
	xr_reader* r = fs.r_open(path, name);
	if (r) {
		msg("loading %s", name);
		T* instance = new T(*r);
		fs.r_close(r);
		return instance;
	} else if (required) {
		msg("can't load %s", name);
		xr_not_expected();
	}
	return 0;
}